

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmmd.cpp
# Opt level: O0

void __thiscall image_match::rgb2hmmd_pixel_inplace(image_match *this,pixel p)

{
  byte bVar1;
  byte *pbVar2;
  reference puVar3;
  byte local_45;
  byte local_3e;
  byte local_3d;
  byte local_31;
  byte local_2a;
  byte local_29;
  uchar local_1d;
  undefined1 auStack_18 [3];
  value_type hue;
  value_type diff;
  value_type sum;
  value_type max;
  value_type min;
  pixel p_local;
  
  p_local.first_ = p.first_;
  _auStack_18 = this;
  pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,0);
  bVar1 = *pbVar2;
  pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,1);
  if (bVar1 < *pbVar2) {
    pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,0);
    bVar1 = *pbVar2;
    pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,2);
    if (bVar1 < *pbVar2) {
      pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,0);
      local_29 = *pbVar2;
    }
    else {
      pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,2);
      local_29 = *pbVar2;
    }
    local_2a = local_29;
  }
  else {
    pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,1);
    bVar1 = *pbVar2;
    pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,2);
    if (bVar1 < *pbVar2) {
      pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,1);
      local_31 = *pbVar2;
    }
    else {
      pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,2);
      local_31 = *pbVar2;
    }
    local_2a = local_31;
  }
  pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,0);
  bVar1 = *pbVar2;
  pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,1);
  if (*pbVar2 < bVar1) {
    pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,0);
    bVar1 = *pbVar2;
    pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,2);
    if (*pbVar2 < bVar1) {
      pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,0);
      local_3d = *pbVar2;
    }
    else {
      pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,2);
      local_3d = *pbVar2;
    }
    local_3e = local_3d;
  }
  else {
    pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,1);
    bVar1 = *pbVar2;
    pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,2);
    if (*pbVar2 < bVar1) {
      pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,1);
      local_45 = *pbVar2;
    }
    else {
      pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,2);
      local_45 = *pbVar2;
    }
    local_3e = local_45;
  }
  local_1d = '\0';
  if ((byte)(local_3e - local_2a) != '\0') {
    pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,0);
    if (local_3e == *pbVar2) {
      pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,1);
      bVar1 = *pbVar2;
      pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,2);
      local_1d = (uchar)((int)(((uint)bVar1 - (uint)*pbVar2) * 0x2b) /
                        (int)((uint)local_3e - (uint)local_2a));
    }
    else {
      pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,1);
      if (local_3e == *pbVar2) {
        pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,2);
        bVar1 = *pbVar2;
        pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,0);
        local_1d = (char)((int)(((uint)bVar1 - (uint)*pbVar2) * 0x2b) /
                         (int)((uint)local_3e - (uint)local_2a)) + 'U';
      }
      else {
        pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,0);
        bVar1 = *pbVar2;
        pbVar2 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,1);
        local_1d = (char)((int)(((uint)bVar1 - (uint)*pbVar2) * 0x2b) /
                         (int)((uint)local_3e - (uint)local_2a)) + 0xab;
      }
    }
  }
  puVar3 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,0);
  *puVar3 = local_1d;
  puVar3 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,1);
  *puVar3 = (uchar)((int)((uint)local_3e + (uint)local_2a) >> 1);
  puVar3 = gsl::span<unsigned_char>::operator[]((span<unsigned_char> *)auStack_18,2);
  *puVar3 = local_3e - local_2a;
  return;
}

Assistant:

void
rgb2hmmd_pixel_inplace(pixel p)
{
    pixel::value_type min, max;

    min =
      p[0] < p[1] ? (p[0] < p[2] ? p[0] : p[2]) : (p[1] < p[2] ? p[1] : p[2]);
    max =
      p[0] > p[1] ? (p[0] > p[2] ? p[0] : p[2]) : (p[1] > p[2] ? p[1] : p[2]);

    pixel::value_type sum, diff, hue;
    diff = max - min;
    sum = static_cast<pixel::value_type>(
      (static_cast<int>(max) + static_cast<int>(min)) >> 1);
    hue = 0;

    // Hue is defined same as in HSV
    if (diff) {
        if (max == p[0])
            hue = 43 * (p[1] - p[2]) / (max - min);
        else if (max == p[1])
            hue = 85 + 43 * (p[2] - p[0]) / (max - min);
        else
            hue = 171 + 43 * (p[0] - p[1]) / (max - min);
    }

    p[0] = hue;
    p[1] = sum;
    p[2] = diff;
}